

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t
psa_asymmetric_decrypt
          (psa_key_handle_t handle,psa_algorithm_t alg,uint8_t *input,size_t input_length,
          uint8_t *salt,size_t salt_length,uint8_t *output,size_t output_size,size_t *output_length)

{
  uint uVar1;
  mbedtls_rsa_context *ctx;
  psa_status_t pVar2;
  int ret;
  size_t sVar3;
  psa_key_slot_t *slot;
  
  *output_length = 0;
  if ((alg & 0xffffff00) == 0x12030000 || salt_length == 0) {
    pVar2 = psa_get_key_from_slot(handle,&slot,0x200,alg);
    if (pVar2 != 0) {
      return pVar2;
    }
    uVar1._0_2_ = (slot->attr).type;
    uVar1._2_2_ = (slot->attr).bits;
    if ((~uVar1 & 0x7000) == 0) {
      if ((uVar1 & 0xffff) != 0x7001) {
        return -0x86;
      }
      ctx = (slot->data).rsa;
      sVar3 = mbedtls_rsa_get_len(ctx);
      if (sVar3 == input_length) {
        if (alg == 0x12020000) {
          ret = mbedtls_rsa_pkcs1_decrypt
                          (ctx,mbedtls_ctr_drbg_random,&global_data.ctr_drbg,1,output_length,input,
                           output,output_size);
        }
        else {
          if ((alg & 0xffffff00) != 0x12030000) {
            return -0x87;
          }
          psa_rsa_oaep_set_padding_mode(alg,ctx);
          ret = mbedtls_rsa_rsaes_oaep_decrypt
                          (ctx,mbedtls_ctr_drbg_random,&global_data.ctr_drbg,1,salt,salt_length,
                           output_length,input,output,output_size);
        }
        pVar2 = mbedtls_to_psa_error(ret);
        return pVar2;
      }
    }
  }
  return -0x87;
}

Assistant:

psa_status_t psa_asymmetric_decrypt( psa_key_handle_t handle,
                                     psa_algorithm_t alg,
                                     const uint8_t *input,
                                     size_t input_length,
                                     const uint8_t *salt,
                                     size_t salt_length,
                                     uint8_t *output,
                                     size_t output_size,
                                     size_t *output_length )
{
    psa_key_slot_t *slot;
    psa_status_t status;

    (void) input;
    (void) input_length;
    (void) salt;
    (void) output;
    (void) output_size;

    *output_length = 0;

    if( ! PSA_ALG_IS_RSA_OAEP( alg ) && salt_length != 0 )
        return( PSA_ERROR_INVALID_ARGUMENT );

    status = psa_get_transparent_key( handle, &slot, PSA_KEY_USAGE_DECRYPT, alg );
    if( status != PSA_SUCCESS )
        return( status );
    if( ! PSA_KEY_TYPE_IS_KEY_PAIR( slot->attr.type ) )
        return( PSA_ERROR_INVALID_ARGUMENT );

#if defined(MBEDTLS_RSA_C)
    if( slot->attr.type == PSA_KEY_TYPE_RSA_KEY_PAIR )
    {
        mbedtls_rsa_context *rsa = slot->data.rsa;
        int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

        if( input_length != mbedtls_rsa_get_len( rsa ) )
            return( PSA_ERROR_INVALID_ARGUMENT );

#if defined(MBEDTLS_PKCS1_V15)
        if( alg == PSA_ALG_RSA_PKCS1V15_CRYPT )
        {
            ret = mbedtls_rsa_pkcs1_decrypt( rsa,
                                             mbedtls_ctr_drbg_random,
                                             &global_data.ctr_drbg,
                                             MBEDTLS_RSA_PRIVATE,
                                             output_length,
                                             input,
                                             output,
                                             output_size );
        }
        else
#endif /* MBEDTLS_PKCS1_V15 */
#if defined(MBEDTLS_PKCS1_V21)
        if( PSA_ALG_IS_RSA_OAEP( alg ) )
        {
            psa_rsa_oaep_set_padding_mode( alg, rsa );
            ret = mbedtls_rsa_rsaes_oaep_decrypt( rsa,
                                                  mbedtls_ctr_drbg_random,
                                                  &global_data.ctr_drbg,
                                                  MBEDTLS_RSA_PRIVATE,
                                                  salt, salt_length,
                                                  output_length,
                                                  input,
                                                  output,
                                                  output_size );
        }
        else
#endif /* MBEDTLS_PKCS1_V21 */
        {
            return( PSA_ERROR_INVALID_ARGUMENT );
        }

        return( mbedtls_to_psa_error( ret ) );
    }
    else
#endif /* defined(MBEDTLS_RSA_C) */
    {
        return( PSA_ERROR_NOT_SUPPORTED );
    }
}